

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

void Excel::Parser::loadBook(istream *fileStream,IStorage *storage,string *fileName)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr __n;
  wchar_t *__s2;
  istream *cstream;
  int iVar3;
  _Base_ptr p_Var4;
  Stream *this;
  SAT *ssat;
  long lVar5;
  size_t sheetIdx;
  bool bVar6;
  vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_> boundSheets;
  File file;
  wstring local_348;
  wchar_t *local_328;
  _Base_ptr local_320;
  long local_318 [2];
  Directory local_308;
  File local_2d0;
  
  std::ifstream::ifstream(&local_2d0);
  local_2d0.m_header.m_byteOrder = LittleEndian;
  local_2d0.m_header.m_sectorSize = 0;
  local_2d0.m_header.m_shortSectorSize = 0;
  local_2d0.m_header.m_sectorsInSAT = 0;
  local_2d0.m_header.m_dirStreamSecID.m_id = 0;
  local_2d0.m_header.m_streamMinSize = 0;
  local_2d0.m_header.m_ssatFirstSecID.m_id = 0;
  local_2d0.m_header.m_sectorsInSSAT = 0;
  local_2d0.m_header.m_msatFirstSecID.m_id = 0;
  local_2d0._564_8_ = 0;
  local_2d0.m_sat.m_sat.
  super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
  super__Vector_impl_data._4_8_ = 0;
  local_2d0.m_sat.m_sat.
  super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
  super__Vector_impl_data._12_8_ = 0;
  local_2d0._588_8_ = 0;
  local_2d0.m_ssat.m_sat.
  super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
  super__Vector_impl_data._4_8_ = 0;
  local_2d0.m_ssat.m_sat.
  super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
  super__Vector_impl_data._12_8_ = 0;
  local_2d0._612_8_ = 0xfffffffe00000000;
  p_Var2 = &local_2d0.m_dirs._M_t._M_impl.super__Rb_tree_header;
  local_2d0.m_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2d0.m_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2d0.m_dirs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2d0.m_stream = fileStream;
  local_2d0.m_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_2d0.m_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  CompoundFile::File::initialize(&local_2d0,fileName);
  local_328 = (wchar_t *)local_318;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_328,L"Workbook",L"");
  __s2 = local_328;
  bVar6 = (_Rb_tree_header *)local_2d0.m_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left
          != p_Var2;
  if (bVar6) {
    bVar6 = true;
    p_Var4 = local_2d0.m_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      __n = p_Var4[1]._M_left;
      if (__n == local_320) {
        if (__n == (_Base_ptr)0x0) break;
        iVar3 = wmemcmp((wchar_t *)p_Var4[1]._M_parent,__s2,(size_t)__n);
        if (iVar3 == 0) break;
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      bVar6 = (_Rb_tree_header *)p_Var4 != p_Var2;
    } while (bVar6);
  }
  paVar1 = &local_348.field_2;
  local_348._M_dataplus._M_p = (pointer)paVar1;
  if (bVar6) {
    std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_348,L"Workbook",L"");
    CompoundFile::File::directory(&local_308,&local_2d0,&local_348);
  }
  else {
    std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_348,L"Book",L"");
    CompoundFile::File::directory(&local_308,&local_2d0,&local_348);
  }
  cstream = local_2d0.m_stream;
  this = (Stream *)operator_new(0x90);
  ssat = &local_2d0.m_ssat;
  CompoundFile::Stream::Stream
            (this,&local_2d0.m_header,&local_2d0.m_sat,ssat,&local_308,
             &local_2d0.m_shortStreamFirstSector,cstream);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_308.m_name._M_dataplus._M_p != &local_308.m_name.field_2) {
    operator_delete(local_308.m_name._M_dataplus._M_p,
                    local_308.m_name.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_348._M_dataplus._M_p != paVar1) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_328 != (wchar_t *)local_318) {
    operator_delete(local_328,local_318[0] * 4 + 4);
  }
  local_308.m_name._M_dataplus._M_p = (pointer)0x0;
  local_308.m_name._M_string_length = 0;
  local_308.m_name.field_2._M_allocated_capacity = 0;
  loadGlobals((Parser *)&local_308,
              (vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_> *)this,
              (Stream *)storage,(IStorage *)ssat);
  if ((pointer)local_308.m_name._M_string_length != local_308.m_name._M_dataplus._M_p) {
    lVar5 = 8;
    sheetIdx = 0;
    do {
      if (*(int *)((long)local_308.m_name._M_dataplus._M_p + lVar5 + -4) == 0) {
        (*storage->_vptr_IStorage[4])
                  (storage,sheetIdx,(long)local_308.m_name._M_dataplus._M_p + lVar5);
        loadSheet(sheetIdx,(BoundSheet *)((long)local_308.m_name._M_dataplus._M_p + lVar5 + -8),
                  (Stream *)this,storage);
      }
      sheetIdx = sheetIdx + 1;
      lVar5 = lVar5 + 0x28;
    } while (sheetIdx <
             (ulong)(((long)(local_308.m_name._M_string_length -
                            (long)local_308.m_name._M_dataplus._M_p) >> 3) * -0x3333333333333333));
  }
  std::vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_>::~vector
            ((vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_> *)&local_308);
  (*(this->super_Stream)._vptr_Stream[1])(this);
  CompoundFile::File::~File(&local_2d0);
  return;
}

Assistant:

inline void
Parser::loadBook( std::istream & fileStream, IStorage & storage,
	const std::string & fileName )
{
	static_assert( sizeof( double ) == 8,
		"Unsupported platform: double has to be 8 bytes." );

	try {
		CompoundFile::File file( fileStream, fileName );
		auto stream = file.stream( 
			file.hasDirectory( L"Workbook" ) ? file.directory( L"Workbook" ) 
			                                 : file.directory( L"Book") );

		std::vector< BoundSheet > boundSheets;

		loadGlobals( boundSheets, *stream, storage );

		loadWorkSheets( boundSheets, *stream, storage );
	}
	catch( const CompoundFile::Exception & x )
	{
		throw Exception( x.whatAsWString() );
	}
}